

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_id.c
# Opt level: O0

int mpt_message_id2buf(uint64_t id,void *ptr,size_t len)

{
  int local_34;
  int used;
  uint8_t *buf;
  size_t len_local;
  void *ptr_local;
  uint64_t id_local;
  
  if (len == 0) {
    id_local._4_4_ = 0;
    if (id != 0) {
      id_local._4_4_ = -0x11;
    }
  }
  else {
    *(uint8_t *)((long)ptr + (long)(len - 1)) = (uint8_t)id;
    local_34 = 1;
    buf = (uint8_t *)(len - 1);
    ptr_local = (void *)id;
    while (buf != (uint8_t *)0x0) {
      if ((void *)((ulong)ptr_local >> 8) != (void *)0x0) {
        local_34 = local_34 + 1;
      }
      *(uint8_t *)((long)ptr + (long)(buf + -1)) = (uint8_t)((ulong)ptr_local >> 8);
      buf = buf + -1;
      ptr_local = (void *)((ulong)ptr_local >> 8);
    }
    if (ptr_local == (void *)0x0) {
      if ((*ptr & 0x80) == 0) {
        id_local._4_4_ = local_34;
      }
      else {
        id_local._4_4_ = -2;
      }
    }
    else {
      id_local._4_4_ = -0x11;
    }
  }
  return id_local._4_4_;
}

Assistant:

int mpt_message_id2buf(uint64_t id, void *ptr, size_t len)
{
	uint8_t *buf = ptr;
	int used;
	if (!len--) {
		return id ? MPT_ERROR(MissingBuffer) : 0;
	}
	buf[len] = 0xff & id;
	used = 1;
	while (len--) {
		id /= 0x100;
		if (id) ++used;
		buf[len] = 0xff & id;
	}
	if (id) {
		return MPT_ERROR(MissingBuffer);
	}
	if ((*buf & 0x80)) {
		return MPT_ERROR(BadValue);
	}
	return used;
}